

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  Rep *pRVar4;
  DescriptorProto *message_type;
  FieldDescriptorProto *field;
  StringPiece SVar5;
  bool bVar6;
  long *plVar7;
  undefined8 *puVar8;
  long lVar9;
  StringPiece *pSVar10;
  LogMessage *pLVar11;
  size_t sVar12;
  void **ppvVar13;
  long lVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_bool>
  pVar16;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  StringPiece local_40;
  
  local_78._0_8_ = value.first;
  local_78._8_4_ = value.second;
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_68._0_8_ = &local_58;
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::emplace_back<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>
            (&this->all_values_,(EncodedEntry *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  plVar7 = (long *)((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar9 = *plVar7;
  sVar2 = plVar7[1];
  if ((long)sVar2 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar2,"string length exceeds max size");
  }
  bVar15 = sVar2 == 0;
  if (!bVar15) {
    sVar12 = 0;
    do {
      bVar1 = *(byte *)(lVar9 + sVar12);
      if ((((bVar1 != 0x2e) && (bVar1 != 0x5f)) && ((byte)(bVar1 - 0x3a) < 0xf6)) &&
         ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) break;
      sVar12 = sVar12 + 1;
      bVar15 = sVar2 == sVar12;
    } while (!bVar15);
  }
  if (bVar15) {
    puVar8 = (undefined8 *)((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    pcVar3 = (char *)*puVar8;
    sVar2 = puVar8[1];
    if ((long)sVar2 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar2,"string length exceeds max size");
    }
    local_40.ptr_ = pcVar3;
    local_40.length_ = sVar2;
    stringpiece_internal::StringPiece::ToString_abi_cxx11_((string *)local_78,&local_40);
    std::__cxx11::string::operator=
              ((string *)
               &(this->all_values_).
                super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].encoded_package,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_);
    }
    local_78._0_4_ =
         (int)((ulong)((long)(this->all_values_).
                             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->all_values_).
                            super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
    puVar8 = (undefined8 *)((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    pcVar3 = (char *)*puVar8;
    sVar2 = puVar8[1];
    if ((long)sVar2 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar2,"string length exceeds max size");
    }
    local_40.ptr_ = pcVar3;
    local_40.length_ = sVar2;
    stringpiece_internal::StringPiece::ToString_abi_cxx11_((string *)(local_78 + 8),&local_40);
    pVar16 = std::
             _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>
             ::
             _M_insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&>
                       ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>
                         *)&this->by_name_,(FileEntry *)local_78);
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if ((undefined1 *)CONCAT44(local_78._12_4_,local_78._8_4_) != local_68 + 8) {
        operator_delete((undefined1 *)CONCAT44(local_78._12_4_,local_78._8_4_));
      }
    }
    else {
      bVar15 = std::
               binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                         ((this->by_name_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->by_name_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (this->by_name_)._M_t._M_impl.
                          super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                          ._M_key_compare.index);
      if ((undefined1 *)CONCAT44(local_78._12_4_,local_78._8_4_) != local_68 + 8) {
        operator_delete((undefined1 *)CONCAT44(local_78._12_4_,local_78._8_4_));
      }
      if (!bVar15) {
        pRVar4 = (file->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar13 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar13 = (void **)0x0;
        }
        lVar9 = (long)(file->message_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar15 = lVar9 == 0;
        if (!bVar15) {
          lVar14 = 0;
          do {
            message_type = *(DescriptorProto **)((long)ppvVar13 + lVar14);
            pSVar10 = (StringPiece *)
                      ((ulong)(message_type->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddSymbol(this,SVar5);
            if (!bVar6) {
LAB_0038cf70:
              if (!bVar15) {
                return false;
              }
              break;
            }
            pSVar10 = (StringPiece *)((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,SVar5,message_type);
            if (!bVar6) goto LAB_0038cf70;
            lVar14 = lVar14 + 8;
            bVar15 = lVar9 << 3 == lVar14;
          } while (!bVar15);
        }
        pRVar4 = (file->enum_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar13 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar13 = (void **)0x0;
        }
        lVar9 = (long)(file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar15 = lVar9 == 0;
        if (!bVar15) {
          lVar14 = 0;
          do {
            pSVar10 = (StringPiece *)
                      (*(ulong *)(*(long *)((long)ppvVar13 + lVar14) + 0x60) & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddSymbol(this,SVar5);
            if (!bVar6) {
              if (!bVar15) {
                return false;
              }
              break;
            }
            lVar14 = lVar14 + 8;
            bVar15 = lVar9 * 8 == lVar14;
          } while (!bVar15);
        }
        pRVar4 = (file->extension_).super_RepeatedPtrFieldBase.rep_;
        ppvVar13 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar13 = (void **)0x0;
        }
        lVar9 = (long)(file->extension_).super_RepeatedPtrFieldBase.current_size_;
        bVar15 = lVar9 == 0;
        if (!bVar15) {
          lVar14 = 0;
          do {
            field = *(FieldDescriptorProto **)((long)ppvVar13 + lVar14);
            pSVar10 = (StringPiece *)((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddSymbol(this,SVar5);
            if (!bVar6) {
LAB_0038d0ca:
              if (!bVar15) {
                return false;
              }
              break;
            }
            pSVar10 = (StringPiece *)((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddExtension<google::protobuf::FieldDescriptorProto>(this,SVar5,field);
            if (!bVar6) goto LAB_0038d0ca;
            lVar14 = lVar14 + 8;
            bVar15 = lVar9 << 3 == lVar14;
          } while (!bVar15);
        }
        pRVar4 = (file->service_).super_RepeatedPtrFieldBase.rep_;
        ppvVar13 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          ppvVar13 = (void **)0x0;
        }
        lVar9 = (long)(file->service_).super_RepeatedPtrFieldBase.current_size_;
        bVar15 = lVar9 == 0;
        if (!bVar15) {
          lVar14 = 0;
          while( true ) {
            pSVar10 = (StringPiece *)
                      (*(ulong *)(*(long *)((long)ppvVar13 + lVar14) + 0x30) & 0xfffffffffffffffe);
            sVar2 = pSVar10->length_;
            SVar5 = *pSVar10;
            if ((long)sVar2 < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (sVar2,"string length exceeds max size");
            }
            bVar6 = AddSymbol(this,SVar5);
            if (!bVar6) break;
            lVar14 = lVar14 + 8;
            bVar15 = lVar9 * 8 == lVar14;
            if (bVar15) {
              return bVar15;
            }
          }
          return bVar15;
        }
        return bVar15;
      }
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x281);
    pLVar11 = internal::LogMessage::operator<<
                        ((LogMessage *)local_78,"File already exists in database: ");
    pLVar11 = internal::LogMessage::operator<<
                        (pLVar11,(string *)
                                 ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar11);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x277);
    pLVar11 = internal::LogMessage::operator<<((LogMessage *)local_78,"Invalid package name: ");
    pLVar11 = internal::LogMessage::operator<<
                        (pLVar11,(string *)
                                 ((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar11);
  }
  internal::LogMessage::~LogMessage((LogMessage *)local_78);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    GOOGLE_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!InsertIfNotPresent(
          &by_name_, FileEntry{static_cast<int>(all_values_.size() - 1),
                               EncodeString(file.name())}) ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}